

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockExpectedCall_callWithIntegerParameter_Test::
~TEST_MockExpectedCall_callWithIntegerParameter_Test
          (TEST_MockExpectedCall_callWithIntegerParameter_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithIntegerParameter)
{
    const SimpleString paramName = "paramName";
    int value = 2;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("int", call->getInputParameterType(paramName).asCharString());
    LONGS_EQUAL(value, call->getInputParameter(paramName).getIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> int paramName: <2 (0x2)>", call->callToString().asCharString());
}